

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_interface.cc
# Opt level: O2

void init_interface(module *m)

{
  handle hVar1;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> cVar2;
  cpp_function cVar3;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> _Var4;
  class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *pcVar5;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> *cls;
  class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
  *this;
  class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *pcVar6;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  offset_in_Var_to_subr local_f8 [4];
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
  local_d8;
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
  modport_interface;
  object local_c8;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_c0;
  handle local_b8;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> local_b0;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> interface;
  class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_> ref;
  object local_98;
  undefined8 local_90;
  unique_function_record local_88;
  unique_function_record unique_rec;
  cpp_function local_78;
  cpp_function cf;
  cpp_function local_60;
  cpp_function cf_1;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_50;
  unique_function_record unique_rec_2;
  cpp_function local_40;
  cpp_function cf_3;
  
  pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
  class_<>(&local_b0,(m->super_object).super_handle.m_ptr,"Interface");
  pybind11::detail::initimpl::
  constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::
  execute<pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>,_0>
            (&local_b0);
  local_88._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )kratos::InterfaceDefinition::input;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     ((class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>
                       *)&local_b0,"input",(offset_in_Var_to_subr *)&local_88);
  local_60.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceDefinition::output;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar5,"output",(offset_in_Var_to_subr *)&local_60);
  local_50._M_head_impl = (function_record *)kratos::InterfaceDefinition::var;
  unique_rec_2._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar5,"var",(offset_in_Var_to_subr *)&local_50);
  local_40.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceDefinition::var;
  cf_3.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)>
                     (pcVar5,"var",(offset_in_Var_to_subr *)&local_40);
  cf.super_function.super_object.super_handle.m_ptr = (function)kratos::InterfaceDefinition::var;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int)>
                     (pcVar5,"var",(offset_in_Var_to_subr *)&cf);
  local_98.super_handle.m_ptr = (handle)kratos::InterfaceDefinition::port;
  local_90 = 0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection)>
                     (pcVar5,"port",(offset_in_Var_to_subr *)&local_98);
  local_d8.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)kratos::InterfaceDefinition::port;
  modport_interface.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(object)0x0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection)>
                     (pcVar5,"port",(offset_in_Var_to_subr *)&local_d8);
  interface.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)kratos::InterfaceDefinition::port;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection,kratos::PortType)>
                     (pcVar5,"port",(offset_in_Var_to_subr *)&interface);
  local_128 = kratos::InterfaceDefinition::clock;
  local_120 = 0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar5,"clock",(offset_in_Var_to_subr *)&local_128);
  local_118 = kratos::InterfaceDefinition::reset;
  local_110 = 0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar5,"reset",(offset_in_Var_to_subr *)&local_118);
  local_108 = kratos::InterfaceDefinition::create_modport_def;
  local_100 = 0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::shared_ptr<kratos::InterfaceModPortDefinition>(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar5,"modport",(offset_in_Var_to_subr *)&local_108);
  local_f8[0] = 9;
  local_f8[1] = 0;
  pcVar5 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<bool(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)const>
                     (pcVar5,"has_var",local_f8);
  local_f8[2] = 1;
  local_f8[3] = 0;
  cls = pybind11::class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
        def<bool(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)const>
                  (pcVar5,"has_port",local_f8 + 2);
  hVar1.m_ptr = (cls->super_generic_type).super_object.super_handle.m_ptr;
  local_c8.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_b8,hVar1,"__contains__",(PyObject *)&_Py_NoneStruct);
  local_78.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_c0);
  (local_c0._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_0,bool,kratos::InterfaceDefinition&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_0&&,bool(*)(kratos::InterfaceDefinition&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_c0._M_head_impl)->name = "__contains__";
  (local_c0._M_head_impl)->field_0x59 = (local_c0._M_head_impl)->field_0x59 | 0x10;
  ((local_c0._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_c0._M_head_impl)->sibling).m_ptr = local_b8.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&local_78,(unique_function_record *)&local_c0,"({%}, {str}) -> bool",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_0,bool,kratos::InterfaceDefinition&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_0&&,bool(*)(kratos::InterfaceDefinition&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_c0);
  pybind11::object::~object((object *)&local_b8);
  pybind11::object::~object(&local_c8);
  pybind11::detail::add_class_method((object *)cls,"__contains__",&local_78);
  pybind11::object::~object((object *)&local_78);
  pybind11::
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>::
  class_<>(&local_d8,(m->super_object).super_handle.m_ptr,"ModPortInterface");
  local_88._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )kratos::InterfaceModPortDefinition::set_input;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  this = (class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
          *)pybind11::
            class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
            ::def<void(kratos::InterfaceModPortDefinition::*)(std::__cxx11::string_const&)>
                      ((class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
                        *)&local_d8,"set_input",(offset_in_Var_to_subr *)&local_88);
  local_60.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceModPortDefinition::set_output;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::
  class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>::
  def<void(kratos::InterfaceModPortDefinition::*)(std::__cxx11::string_const&)>
            (this,"set_output",(offset_in_Var_to_subr *)&local_60);
  pybind11::class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_>::class_<>
            ((class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_> *)&interface,
             (m->super_object).super_handle.m_ptr,"InterfaceRef");
  cVar2 = interface;
  local_40.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_50,
                    (handle)interface.super_generic_type.super_object.super_handle.m_ptr,"var",
                    (PyObject *)&_Py_NoneStruct);
  _Var4._M_head_impl = local_50._M_head_impl;
  local_60.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_88);
  *(code **)((long)local_88._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_1,kratos::Var&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_1&&,kratos::Var&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_88._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl = "var";
  *(code *)((long)local_88._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       (code)((byte)*(code *)((long)local_88._M_t.
                                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                                    .
                                    super__Head_base<0UL,_pybind11::detail::function_record_*,_false>
                                    ._M_head_impl + 0x59) | 0x10);
  ((generic_type *)
  ((long)local_88._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  super_object = (object)cVar2.super_generic_type.super_object.super_handle.m_ptr;
  *(function_record **)
   ((long)local_88._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78) =
       _Var4._M_head_impl;
  *(code *)((long)local_88._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x58) = (code)0x5;
  pybind11::cpp_function::initialize_generic
            (&local_60,&local_88,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_1,kratos::Var&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_1&&,kratos::Var&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_88);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::detail::add_class_method((object *)&interface,"var",&local_60);
  pybind11::object::~object((object *)&local_60);
  cVar2 = interface;
  local_40.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&local_50,
                    (handle)interface.super_generic_type.super_object.super_handle.m_ptr,"port",
                    (PyObject *)&_Py_NoneStruct);
  _Var4._M_head_impl = local_50._M_head_impl;
  local_60.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_88);
  *(code **)((long)local_88._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_2,kratos::Port&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_2&&,kratos::Port&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_88._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl = "port"
  ;
  *(code *)((long)local_88._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       (code)((byte)*(code *)((long)local_88._M_t.
                                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                                    .
                                    super__Head_base<0UL,_pybind11::detail::function_record_*,_false>
                                    ._M_head_impl + 0x59) | 0x10);
  ((handle *)
  ((long)local_88._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = (PyObject *)cVar2.super_generic_type.super_object.super_handle.m_ptr;
  ((handle *)
  ((long)local_88._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = (PyObject *)_Var4._M_head_impl;
  *(code *)((long)local_88._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x58) = (code)0x5;
  pybind11::cpp_function::initialize_generic
            (&local_60,&local_88,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_2,kratos::Port&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_2&&,kratos::Port&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_88);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::detail::add_class_method((object *)&interface,"port",&local_60);
  pybind11::object::~object((object *)&local_60);
  local_88._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )kratos::InterfaceRef::has_var;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar6 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)const>
                     ((class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
                      &interface,"has_var",(offset_in_Var_to_subr *)&local_88);
  local_60.super_function.super_object.super_handle.m_ptr = (function)kratos::InterfaceRef::has_port
  ;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar6 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)const>
                     (pcVar6,"has_port",(offset_in_Var_to_subr *)&local_60);
  hVar1.m_ptr = *(PyObject **)pcVar6;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf,hVar1,"__contains__",(PyObject *)&_Py_NoneStruct);
  cVar3 = cf;
  local_40.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_3,bool,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_3&&,bool(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "__contains__";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_50._M_head_impl)->sibling).m_ptr =
       (PyObject *)cVar3.super_function.super_object.super_handle.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&local_40,(unique_function_record *)&local_50,"({%}, {str}) -> bool",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_3,bool,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_3&&,bool(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&cf);
  pybind11::object::~object(&local_98);
  pybind11::detail::add_class_method((object *)pcVar6,"__contains__",&local_40);
  pybind11::object::~object((object *)&local_40);
  hVar1.m_ptr = *(PyObject **)pcVar6;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf,hVar1,"__getitem__",(PyObject *)&_Py_NoneStruct);
  cVar3 = cf;
  local_40.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_4,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_4&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "__getitem__";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_50._M_head_impl)->sibling).m_ptr =
       (PyObject *)cVar3.super_function.super_object.super_handle.m_ptr;
  (local_50._M_head_impl)->policy = reference;
  pybind11::cpp_function::initialize_generic
            (&local_40,(unique_function_record *)&local_50,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_4,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_4&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&cf);
  pybind11::object::~object(&local_98);
  pybind11::detail::add_class_method((object *)pcVar6,"__getitem__",&local_40);
  pybind11::object::~object((object *)&local_40);
  hVar1.m_ptr = *(PyObject **)pcVar6;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  pybind11::getattr((pybind11 *)&cf,hVar1,"__getattr__",(PyObject *)&_Py_NoneStruct);
  cVar3 = cf;
  local_40.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_5,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_5&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "__getattr__";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_50._M_head_impl)->sibling).m_ptr =
       (PyObject *)cVar3.super_function.super_object.super_handle.m_ptr;
  (local_50._M_head_impl)->policy = reference;
  pybind11::cpp_function::initialize_generic
            (&local_40,(unique_function_record *)&local_50,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_5,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_5&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&cf);
  pybind11::object::~object(&local_98);
  pybind11::detail::add_class_method((object *)pcVar6,"__getattr__",&local_40);
  pybind11::object::~object((object *)&local_40);
  local_50._M_head_impl = (function_record *)kratos::InterfaceRef::has_modport;
  unique_rec_2._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar6 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)>
                     (pcVar6,"has_modport",(offset_in_Var_to_subr *)&local_50);
  local_40.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceRef::get_modport_ref;
  cf_3.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
  def<std::shared_ptr<kratos::InterfaceRef>(kratos::InterfaceRef::*)(std::__cxx11::string_const&)>
            (pcVar6,"get_modport_ref",(offset_in_Var_to_subr *)&local_40);
  pybind11::object::~object((object *)&interface);
  pybind11::object::~object((object *)&local_d8);
  pybind11::object::~object((object *)&local_b0);
  return;
}

Assistant:

void init_interface(py::module &m) {
    using namespace kratos;
    auto interface =
        py::class_<InterfaceDefinition, std::shared_ptr<InterfaceDefinition>>(m, "Interface");
    interface.def(py::init<const std::string &>())
        .def("input", &InterfaceDefinition::input)
        .def("output", &InterfaceDefinition::output)
        .def("var",
             py::overload_cast<const std::string &, uint32_t, uint32_t>(&InterfaceDefinition::var))
        .def("var", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &>(
                        &InterfaceDefinition::var))
        .def("var", py::overload_cast<const std::string &, uint32_t>(&InterfaceDefinition::var))
        .def("port", py::overload_cast<const std::string &, uint32_t, uint32_t, PortDirection>(
                         &InterfaceDefinition::port))
        .def("port", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &,
                                       PortDirection>(&InterfaceDefinition::port))
        .def("port", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &,
                                       PortDirection, PortType>(&InterfaceDefinition::port))
        .def("clock", &InterfaceDefinition::clock)
        .def("reset", &InterfaceDefinition::reset)
        .def("modport", &InterfaceDefinition::create_modport_def)
        .def("has_var", &InterfaceDefinition::has_var)
        .def("has_port", &InterfaceDefinition::has_port)
        .def("__contains__", [](InterfaceDefinition &def, const std::string &name) {
            return def.has_port(name) || def.has_var(name);
        });

    auto modport_interface =
        py::class_<InterfaceModPortDefinition, std::shared_ptr<InterfaceModPortDefinition>>(
            m, "ModPortInterface");
    modport_interface.def("set_input", &InterfaceModPortDefinition::set_input)
        .def("set_output", &InterfaceModPortDefinition::set_output);

    auto ref = py::class_<InterfaceRef, std::shared_ptr<InterfaceRef>>(m, "InterfaceRef");
    ref.def(
           "var", [](InterfaceRef &ref, const std::string &name) -> Var & { return ref.var(name); },
           py::return_value_policy::reference)
        .def(
            "port",
            [](InterfaceRef &ref, const std::string &name) -> Port & { return ref.port(name); },
            py::return_value_policy::reference)
        .def("has_var", &InterfaceRef::has_var)
        .def("has_port", &InterfaceRef::has_port)
        .def("__contains__",
             [](InterfaceRef &ref, const std::string &name) {
                 return ref.has_port(name) || ref.has_var(name);
             })
        .def(
            "__getitem__",
            [](InterfaceRef &ref, const std::string &name) -> Var * {
                if (ref.has_port(name)) {
                    return &ref.port(name);
                } else if (ref.has_var(name)) {
                    return &ref.var(name);
                } else {
                    throw UserException(name + " not exist in " + ref.name());
                }
            },
            py::return_value_policy::reference)
        .def(
            "__getattr__",
            [](InterfaceRef &ref, const std::string &name) -> Var * {
                if (ref.has_port(name)) {
                    return &ref.port(name);
                } else if (ref.has_var(name)) {
                    return &ref.var(name);
                } else if (name == "__len__") {
                    return nullptr;
                } else {
                    throw UserException(name + " not exist in " + ref.name());
                }
            },
            py::return_value_policy::reference)
        .def("has_modport", &InterfaceRef::has_modport)
        .def("get_modport_ref", &InterfaceRef::get_modport_ref);
}